

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall ncnn::Net::clear(Net *this)

{
  layer_destroyer_func p_Var1;
  long *plVar2;
  value_type pLVar3;
  ulong uVar4;
  int iVar5;
  size_type sVar6;
  reference ppLVar7;
  reference pvVar8;
  uint uVar9;
  long in_RDI;
  int custom_index;
  int dret;
  Option opt1;
  Layer *layer;
  size_t i;
  undefined1 local_58 [45];
  undefined1 local_2b;
  value_type local_18;
  ulong local_10;
  
  std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::clear
            ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)0x14e999);
  for (local_10 = 0; uVar4 = local_10,
      sVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                         (*(long *)(in_RDI + 0x48) + 0x20)), uVar4 < sVar6; local_10 = local_10 + 1)
  {
    ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                         (*(long *)(in_RDI + 0x48) + 0x20),local_10);
    local_18 = *ppLVar7;
    memcpy(local_58,(void *)(in_RDI + 8),0x40);
    if ((local_18->support_image_storage & 1U) == 0) {
      local_2b = 0;
    }
    iVar5 = (*local_18->_vptr_Layer[5])(local_18,local_58);
    if (iVar5 != 0) {
      fprintf(_stderr,"layer destroy_pipeline failed");
      fprintf(_stderr,"\n");
    }
    if ((local_18->typeindex & 0x100U) == 0) {
      if (local_18 != (value_type)0x0) {
        (*local_18->_vptr_Layer[1])();
      }
    }
    else {
      uVar9 = local_18->typeindex & 0xfffffeff;
      pvVar8 = std::
               vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
               ::operator[]((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                             *)(*(long *)(in_RDI + 0x48) + 0x98),(long)(int)uVar9);
      if (pvVar8->destroyer == (layer_destroyer_func)0x0) {
        if (local_18 != (value_type)0x0) {
          (*local_18->_vptr_Layer[1])();
        }
      }
      else {
        pvVar8 = std::
                 vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                 ::operator[]((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                               *)(*(long *)(in_RDI + 0x48) + 0x98),(long)(int)uVar9);
        pLVar3 = local_18;
        p_Var1 = pvVar8->destroyer;
        pvVar8 = std::
                 vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                 ::operator[]((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                               *)(*(long *)(in_RDI + 0x48) + 0x98),(long)(int)uVar9);
        (*p_Var1)(pLVar3,pvVar8->userdata);
      }
    }
  }
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::clear
            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)0x14eb97);
  if (*(long *)(*(long *)(in_RDI + 0x48) + 0xb0) != 0) {
    plVar2 = *(long **)(*(long *)(in_RDI + 0x48) + 0xb0);
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
    *(undefined8 *)(*(long *)(in_RDI + 0x48) + 0xb0) = 0;
  }
  if (*(long *)(*(long *)(in_RDI + 0x48) + 0xb8) != 0) {
    plVar2 = *(long **)(*(long *)(in_RDI + 0x48) + 0xb8);
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
    *(undefined8 *)(*(long *)(in_RDI + 0x48) + 0xb8) = 0;
  }
  return;
}

Assistant:

void Net::clear()
{
    d->blobs.clear();
    for (size_t i = 0; i < d->layers.size(); i++)
    {
        Layer* layer = d->layers[i];

        Option opt1 = opt;
        if (!layer->support_image_storage)
        {
            opt1.use_image_storage = false;
        }

        int dret = layer->destroy_pipeline(opt1);
        if (dret != 0)
        {
            NCNN_LOGE("layer destroy_pipeline failed");
            // ignore anyway
        }

        if (layer->typeindex & ncnn::LayerType::CustomBit)
        {
            int custom_index = layer->typeindex & ~ncnn::LayerType::CustomBit;
            if (d->custom_layer_registry[custom_index].destroyer)
            {
                d->custom_layer_registry[custom_index].destroyer(layer, d->custom_layer_registry[custom_index].userdata);
            }
            else
            {
                delete layer;
            }
        }
        else
        {
            delete layer;
        }
    }
    d->layers.clear();

    if (d->local_blob_allocator)
    {
        delete d->local_blob_allocator;
        d->local_blob_allocator = 0;
    }
    if (d->local_workspace_allocator)
    {
        delete d->local_workspace_allocator;
        d->local_workspace_allocator = 0;
    }

#if NCNN_VULKAN
    if (d->weight_vkallocator)
    {
        delete d->weight_vkallocator;
        d->weight_vkallocator = 0;
    }
    if (d->weight_staging_vkallocator)
    {
        delete d->weight_staging_vkallocator;
        d->weight_staging_vkallocator = 0;
    }
    if (d->pipeline_cache)
    {
        delete d->pipeline_cache;
        d->pipeline_cache = 0;
        opt.pipeline_cache = 0;
    }
#endif // NCNN_VULKAN
}